

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O0

void __thiscall cppjieba::DictTrie::LoadDict(DictTrie *this,string *filePath)

{
  byte bVar1;
  undefined1 uVar2;
  undefined8 uVar3;
  ostream *poVar4;
  istream *piVar5;
  size_type sVar6;
  char *__nptr;
  string *in_RSI;
  value_type *__x;
  DictUnit node_info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  buf;
  string line;
  ifstream ifs;
  DictUnit *in_stack_fffffffffffff980;
  ostream *in_stack_fffffffffffff990;
  undefined7 in_stack_fffffffffffff9b0;
  undefined1 in_stack_fffffffffffff9b7;
  size_t in_stack_fffffffffffffa18;
  string *in_stack_fffffffffffffa20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa28;
  string *in_stack_fffffffffffffa30;
  int in_stack_fffffffffffffa3c;
  char *in_stack_fffffffffffffa40;
  size_t in_stack_fffffffffffffa48;
  Logger *in_stack_fffffffffffffa50;
  string *in_stack_fffffffffffffb18;
  double in_stack_fffffffffffffb20;
  string *in_stack_fffffffffffffb28;
  DictUnit *in_stack_fffffffffffffb30;
  DictTrie *in_stack_fffffffffffffb38;
  allocator local_481;
  string local_480 [160];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3e0;
  string local_3c8 [32];
  Logger local_3a8;
  istream local_218 [520];
  string *local_10;
  
  local_10 = in_RSI;
  uVar3 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_218,uVar3,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    limonp::Logger::Logger
              (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
               in_stack_fffffffffffffa3c);
    poVar4 = limonp::Logger::Stream(&local_3a8);
    poVar4 = std::operator<<(poVar4,"exp: [ifs.is_open()");
    poVar4 = std::operator<<(poVar4,"] false. ");
    poVar4 = std::operator<<(poVar4,"open ");
    poVar4 = std::operator<<(poVar4,local_10);
    std::operator<<(poVar4," failed.");
    limonp::Logger::~Logger((Logger *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0))
    ;
  }
  std::__cxx11::string::string(local_3c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x107c00);
  DictUnit::DictUnit(in_stack_fffffffffffff980);
  while( true ) {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_218,local_3c8);
    uVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
    if (!(bool)uVar2) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_480," ",&local_481);
    limonp::Split(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
                  in_stack_fffffffffffffa18);
    std::__cxx11::string::~string(local_480);
    std::allocator<char>::~allocator((allocator<char> *)&local_481);
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_3e0);
    if (sVar6 != 3) {
      limonp::Logger::Logger
                (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
                 in_stack_fffffffffffffa3c);
      poVar4 = limonp::Logger::Stream((Logger *)&stack0xfffffffffffff9f8);
      poVar4 = std::operator<<(poVar4,"exp: [buf.size() == DICT_COLUMN_NUM");
      poVar4 = std::operator<<(poVar4,"] false. ");
      in_stack_fffffffffffff990 = std::operator<<(poVar4,"split result illegal, line:");
      std::operator<<(in_stack_fffffffffffff990,local_3c8);
      limonp::Logger::~Logger((Logger *)CONCAT17(uVar2,in_stack_fffffffffffff9b0));
    }
    in_stack_fffffffffffff980 =
         (DictUnit *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[](&local_3e0,0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_3e0,1);
    __nptr = (char *)std::__cxx11::string::c_str();
    __x = (value_type *)atof(__nptr);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_3e0,2);
    MakeNodeInfo(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                 in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
    std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::push_back
              ((vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *)
               in_stack_fffffffffffff990,__x);
  }
  DictUnit::~DictUnit(in_stack_fffffffffffff980);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff990);
  std::__cxx11::string::~string(local_3c8);
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void LoadDict(const std::string& filePath) {
    std::ifstream ifs(filePath.c_str());
    XCHECK(ifs.is_open()) << "open " << filePath << " failed.";
    std::string line;
    std::vector<std::string> buf;

    DictUnit node_info;
    while (getline(ifs, line)) {
      limonp::Split(line, buf, " ");
      XCHECK(buf.size() == DICT_COLUMN_NUM) << "split result illegal, line:" << line;
      MakeNodeInfo(node_info,
            buf[0],
            atof(buf[1].c_str()),
            buf[2]);
      static_node_infos_.push_back(node_info);
    }
  }